

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

int fctstr_istartswith(char *str,char *check)

{
  int iVar1;
  char *str_00;
  char *check_00;
  
  str_00 = fctstr_clone_lower(str);
  check_00 = fctstr_clone_lower(check);
  iVar1 = fctstr_startswith(str_00,check_00);
  free(str_00);
  free(check_00);
  return iVar1;
}

Assistant:

static int
fctstr_istartswith(char const *str, char const *check)
{
    /* Taking the lazy approach for now. */
    char *istr = fctstr_clone_lower(str);
    char *icheck = fctstr_clone_lower(check);
    /* TODO: check for memory. */
    int startswith = fctstr_startswith(istr, icheck);
    free(istr);
    free(icheck);
    return startswith;
}